

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdDot<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<short,(unsigned_char)8>>
          (Thread *this)

{
  short sVar1;
  short sVar2;
  short sVar3;
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  u8 idx;
  uint uVar4;
  short *psVar5;
  uint *puVar6;
  SL hi;
  SL lo;
  u8 laneidx;
  uint uStack_3c;
  u8 i;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<short,_(unsigned_char)__b_> lhs;
  Simd<short,_(unsigned_char)__b_> rhs;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<short,(unsigned_char)8>>(this);
  for (hi._3_1_ = 0; hi._3_1_ < 4; hi._3_1_ = hi._3_1_ + 1) {
    idx = hi._3_1_ * '\x02';
    psVar5 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(result.v + 2),idx);
    sVar1 = *psVar5;
    psVar5 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(lhs.v + 4),idx);
    sVar2 = *psVar5;
    psVar5 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(result.v + 2),idx + '\x01');
    sVar3 = *psVar5;
    psVar5 = Simd<short,_(unsigned_char)'\b'>::operator[]
                       ((Simd<short,_(unsigned_char)__b_> *)(lhs.v + 4),idx + '\x01');
    uVar4 = Add<unsigned_int>((int)sVar1 * (int)sVar2,(int)sVar3 * (int)*psVar5);
    puVar6 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)&lo,hi._3_1_);
    *puVar6 = uVar4;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = lo;
  value.v[1] = uStack_3c;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdDot() {
  using SL = typename S::LaneType;
  auto rhs = Pop<T>();
  auto lhs = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    u8 laneidx = i * 2;
    SL lo = SL(lhs[laneidx]) * SL(rhs[laneidx]);
    SL hi = SL(lhs[laneidx + 1]) * SL(rhs[laneidx + 1]);
    result[i] = Add(lo, hi);
  }
  Push(result);
  return RunResult::Ok;
}